

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall
BackwardPass::ProcessBailOnNoProfile(BackwardPass *this,Instr *instr,BasicBlock *block)

{
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  BasicBlock *pBVar2;
  BasicBlock *pBVar3;
  code *pcVar4;
  bool bVar5;
  IRKind IVar6;
  ushort uVar7;
  undefined4 *puVar8;
  LabelInstr *pLVar9;
  Instr *pIVar10;
  RegOpnd *pRVar11;
  Type *ppFVar12;
  LabelInstr *pLVar13;
  long lVar14;
  Instr *instr_00;
  BranchInstr *pBVar15;
  uint uVar16;
  Func **ppFVar17;
  TempObjectTracker *this_00;
  Instr *pIVar18;
  Instr **ppIVar19;
  undefined1 local_68 [8];
  Iterator __iter;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *local_50;
  Instr *local_40;
  
  if (this->tag != BackwardPhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2085,"(this->tag == Js::BackwardPhase)","this->tag == Js::BackwardPhase");
    if (!bVar5) goto LAB_003d136c;
    *puVar8 = 0;
  }
  if (instr->m_opcode != BailOnNoProfile) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2086,"(instr->m_opcode == Js::OpCode::BailOnNoProfile)",
                       "instr->m_opcode == Js::OpCode::BailOnNoProfile");
    if (!bVar5) goto LAB_003d136c;
    *puVar8 = 0;
  }
  if ((instr->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2087,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar5) goto LAB_003d136c;
    *puVar8 = 0;
  }
  if (block == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2088,"(block)","block");
    if (!bVar5) {
LAB_003d136c:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return false;
  }
  if ((this->currentRegion != (Region *)0x0) &&
     ((byte)(this->currentRegion->type - RegionTypeCatch) < 2)) {
    return false;
  }
  pIVar10 = instr->m_prev;
  if (((pIVar10->m_kind == InstrKindProfiledLabel) || (pIVar10->m_kind == InstrKindLabel)) &&
     (pLVar9 = IR::Instr::AsLabelInstr(pIVar10), (pLVar9->field_0x78 & 2) != 0)) {
    bVar5 = DoMarkTempObjects(this);
    if (!bVar5) {
      return false;
    }
    this_00 = block->tempObjectTracker;
LAB_003d1362:
    ObjectTemp::ProcessBailOnNoProfile(&this_00->super_ObjectTemp,instr);
    return false;
  }
  ppIVar19 = &instr->m_prev;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_40 = (Instr *)0x0;
  do {
    pIVar18 = pIVar10;
    IVar6 = pIVar18->m_kind;
    if ((IVar6 < 7) && ((0x68U >> (IVar6 & 0x1f) & 1) != 0)) goto LAB_003d0f47;
    bVar5 = IR::Instr::DontHoistBailOnNoProfileAboveInGeneratorFunction(pIVar18);
    if ((bVar5) && (bVar5 = local_40 != (Instr *)0x0, local_40 = pIVar18, bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x20ab,"(insertionPointForGenerator == nullptr)",
                         "insertionPointForGenerator == nullptr");
      if (!bVar5) goto LAB_003d136c;
      *puVar8 = 0;
    }
    uVar16 = pIVar18->m_opcode - 0x248;
    if ((uVar16 < 7) && ((0x67U >> (uVar16 & 0x1f) & 1) != 0)) break;
    bVar5 = OpCodeAttr::CallInstr(pIVar18->m_opcode);
    pIVar10 = pIVar18->m_prev;
  } while ((!bVar5) || (pIVar10->m_opcode == BailOnNoProfile));
  IVar6 = pIVar18->m_kind;
LAB_003d0f47:
  if ((IVar6 == InstrKindLabel) || (IVar6 == InstrKindProfiledLabel)) {
    pLVar9 = IR::Instr::AsLabelInstr(pIVar18);
    pIVar10 = IR::Instr::GetNextRealInstrOrLabel(pIVar18);
    if ((pIVar10->m_opcode != Ld_A) ||
       ((bVar5 = IR::Opnd::IsRegOpnd(pIVar10->m_dst), !bVar5 ||
        (pRVar11 = IR::Opnd::AsRegOpnd(pIVar10->m_dst), (pRVar11->field_0x18 & 8) == 0)))) {
      while( true ) {
        pIVar10 = *ppIVar19;
        if ((pIVar10->m_kind < 7) && ((0x68U >> (pIVar10->m_kind & 0x1f) & 1) != 0)) break;
        if (pIVar10->m_opcode == BailOnNoProfile) {
          if ((pIVar10->field_0x38 & 0x10) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x20e4,"(!curInstr->HasBailOutInfo())","!curInstr->HasBailOutInfo()"
                              );
            if (!bVar5) goto LAB_003d136c;
            *puVar8 = 0;
          }
          pIVar10 = pIVar10->m_next;
          IR::Instr::Remove(pIVar10->m_prev);
        }
        ppIVar19 = &pIVar10->m_prev;
      }
      IR::Instr::Unlink(instr);
      local_68 = (undefined1  [8])&block->predList;
      __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_68;
LAB_003d106a:
      do {
        if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_003d136c;
          *puVar8 = 0;
        }
        pSVar1 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])pSVar1 == local_68) goto LAB_003d12e2;
        __iter.list = pSVar1;
        ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)local_68);
        pBVar2 = (*ppFVar12)->predBlock;
        if (pBVar2 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x20f3,"(pred)","pred");
          if (!bVar5) goto LAB_003d136c;
          *puVar8 = 0;
        }
      } while (((block->field_0x18 & 4) != 0) && (pBVar2->loop == block->loop));
      pLVar13 = IR::Instr::AsLabelInstr(pBVar2->firstInstr);
      if (pLVar13->m_region == this->currentRegion) {
        __iter.current = (NodeBase *)&pBVar2->succList;
        local_50 = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)__iter.current;
        do {
          if (local_50 == (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar5) goto LAB_003d136c;
            *puVar8 = 0;
          }
          local_50 = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
                     (local_50->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
          if (local_50 == (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)__iter.current) {
            if (local_40 != (Instr *)0x0) break;
            pBVar3 = pBVar2->next;
            ppFVar17 = (Func **)&pBVar3->firstInstr;
            if (pBVar3 == (BasicBlock *)0x0) {
              ppFVar17 = &pBVar2->func;
            }
            lVar14 = 0x18;
            if (pBVar3 == (BasicBlock *)0x0) {
              lVar14 = 0xd0;
            }
            pIVar18 = *(Instr **)((long)&(*ppFVar17)->m_alloc + lVar14);
            instr_00 = IR::Instr::Copy(instr,true);
            bVar5 = IR::Instr::EndsBasicBlock(pIVar18);
            if (bVar5) {
              if (pIVar18->m_prev->m_opcode != BailOnNoProfile) {
                if ((pIVar18->m_kind == InstrKindBranch) &&
                   (pBVar15 = IR::Instr::AsBranchInstr(pIVar18), (pBVar15->field_0x58 & 2) == 0)) {
                  instr_00->m_func = pIVar18->m_func;
                  IR::Instr::InsertBefore(pIVar18,instr_00);
                }
                break;
              }
            }
            else if (pIVar18->m_opcode != BailOnNoProfile) {
              instr_00->m_func = pIVar18->m_func;
              IR::Instr::InsertAfter(pIVar18,instr_00);
              break;
            }
            IR::Instr::Free(instr_00);
            break;
          }
          ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                               ((Iterator *)&__iter.current);
          pBVar3 = (*ppFVar12)->succBlock;
          if (pBVar3 == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x2105,"(predSucc)","predSucc");
            if (!bVar5) goto LAB_003d136c;
            *puVar8 = 0;
          }
        } while ((pBVar3 == block) || ((pBVar3->field_0x18 & 0x80) != 0));
        goto LAB_003d106a;
      }
LAB_003d12e2:
      if (block->number == 0) {
        IR::Instr::Free(instr);
        return true;
      }
      pLVar9->field_0x78 = pLVar9->field_0x78 | 0x22;
      instr->m_func = pIVar10->m_func;
      if (local_40 == (Instr *)0x0) {
        IR::Instr::InsertAfter(pIVar10,instr);
        uVar7 = (ushort)*(undefined4 *)&block->field_0x18 | 0x80;
      }
      else {
        IR::Instr::InsertAfter(local_40,instr);
        uVar7 = *(ushort *)&block->field_0x18 & 0xff7f;
      }
      *(ushort *)&block->field_0x18 = uVar7;
      bVar5 = DoMarkTempObjects(this);
      if (!bVar5) {
        return false;
      }
      this_00 = block->tempObjectTracker;
      goto LAB_003d1362;
    }
  }
  BasicBlock::RemoveInstr(block,instr);
  return true;
}

Assistant:

bool
BackwardPass::ProcessBailOnNoProfile(IR::Instr *instr, BasicBlock *block)
{
    Assert(this->tag == Js::BackwardPhase);
    Assert(instr->m_opcode == Js::OpCode::BailOnNoProfile);
    Assert(!instr->HasBailOutInfo());
    AnalysisAssert(block);

    if (this->IsPrePass())
    {
        return false;
    }
    if (this->currentRegion && (this->currentRegion->GetType() == RegionTypeCatch || this->currentRegion->GetType() == RegionTypeFinally))
    {
        return false;
    }

    IR::Instr *curInstr = instr->m_prev;

    if (curInstr->IsLabelInstr() && curInstr->AsLabelInstr()->isOpHelper)
    {
        // Already processed

        if (this->DoMarkTempObjects())
        {
            block->tempObjectTracker->ProcessBailOnNoProfile(instr);
        }
        return false;
    }

    // For generator functions, we don't want to move the BailOutOnNoProfile
    // above certain instructions such as GeneratorResumeYield or
    // CreateInterpreterStackFrameForGenerator. This indicates the insertion
    // point for the BailOutOnNoProfile in such cases.
    IR::Instr *insertionPointForGenerator = nullptr;

    // Don't hoist if we see calls with profile data (recursive calls)
    while(!curInstr->StartsBasicBlock())
    {
        if (curInstr->DontHoistBailOnNoProfileAboveInGeneratorFunction())
        {
            Assert(insertionPointForGenerator == nullptr);
            insertionPointForGenerator = curInstr;
        }

        // If a function was inlined, it must have had profile info.
        if (curInstr->m_opcode == Js::OpCode::InlineeEnd || curInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || curInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd
            || curInstr->m_opcode == Js::OpCode::InlineeStart || curInstr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee)
        {
            break;
        }
        else if (OpCodeAttr::CallInstr(curInstr->m_opcode))
        {
            if (curInstr->m_prev->m_opcode != Js::OpCode::BailOnNoProfile)
            {
                break;
            }
        }
        curInstr = curInstr->m_prev;
    }

    // Didn't get to the top of the block, delete this BailOnNoProfile.
    if (!curInstr->IsLabelInstr())
    {
        block->RemoveInstr(instr);
        return true;
    }

    // Save the head instruction for later use.
    IR::LabelInstr *blockHeadInstr = curInstr->AsLabelInstr();

    // We can't bail in the middle of a "tmp = CmEq s1, s2; BrTrue tmp" turned into a "BrEq s1, s2",
    // because the bailout wouldn't be able to restore tmp.
    IR::Instr *curNext = curInstr->GetNextRealInstrOrLabel();
    IR::Instr *instrNope = nullptr;
    if (curNext->m_opcode == Js::OpCode::Ld_A && curNext->GetDst()->IsRegOpnd() && curNext->GetDst()->AsRegOpnd()->m_fgPeepTmp)
    {
        block->RemoveInstr(instr);
        return true;
        /*while (curNext->m_opcode == Js::OpCode::Ld_A && curNext->GetDst()->IsRegOpnd() && curNext->GetDst()->AsRegOpnd()->m_fgPeepTmp)
        {
            // Instead of just giving up, we can be a little trickier. We can instead treat the tmp declaration(s) as a
            // part of the block prefix, and put the bailonnoprofile immediately after them. This has the added benefit
            // that we can still merge up blocks beginning with bailonnoprofile, even if they would otherwise not allow
            // us to, due to the fact that these tmp declarations would be pre-empted by the higher-level bailout.
            instrNope = curNext;
            curNext = curNext->GetNextRealInstrOrLabel();
        }*/
    }

    curInstr = instr->m_prev;

    // Move to top of block (but just below any fgpeeptemp lds).
    while(!curInstr->StartsBasicBlock() && curInstr != instrNope)
    {
        // Delete redundant BailOnNoProfile
        if (curInstr->m_opcode == Js::OpCode::BailOnNoProfile)
        {
            Assert(!curInstr->HasBailOutInfo());
            curInstr = curInstr->m_next;
            curInstr->m_prev->Remove();
        }
        curInstr = curInstr->m_prev;
    }

    if (instr == block->GetLastInstr())
    {
        block->SetLastInstr(instr->m_prev);
    }

    instr->Unlink();

    // Now try to move this up the flowgraph to the predecessor blocks
    FOREACH_PREDECESSOR_BLOCK(pred, block)
    {
        // Don't hoist BailOnNoProfile up past blocks containing GeneratorResumeYield
        bool hoistBailToPred = (insertionPointForGenerator == nullptr);

        if (block->isLoopHeader && pred->loop == block->loop)
        {
            // Skip loop back-edges
            continue;
        }

        if (pred->GetFirstInstr()->AsLabelInstr()->GetRegion() != this->currentRegion)
        {
            break;
        }

        // If all successors of this predecessor start with a BailOnNoProfile, we should be
        // okay to hoist this bail to the predecessor.
        FOREACH_SUCCESSOR_BLOCK(predSucc, pred)
        {
            if (predSucc == block)
            {
                continue;
            }
            if (!predSucc->beginsBailOnNoProfile)
            {
                hoistBailToPred = false;
                break;
            }
        } NEXT_SUCCESSOR_BLOCK;

        if (hoistBailToPred)
        {
            IR::Instr *predInstr = pred->GetLastInstr();
            IR::Instr *instrCopy = instr->Copy();


            if (predInstr->EndsBasicBlock())
            {
                if (predInstr->m_prev->m_opcode == Js::OpCode::BailOnNoProfile)
                {
                    // We already have one, we don't need a second.
                    instrCopy->Free();
                }
                else if (predInstr->IsBranchInstr() && !predInstr->AsBranchInstr()->m_isSwitchBr)
                {
                    // Don't put a bailout in the middle of a switch dispatch sequence.
                    // The bytecode offsets are not in order, and it would lead to incorrect
                    // bailout info.
                    instrCopy->m_func = predInstr->m_func;
                    predInstr->InsertBefore(instrCopy);
                }
            }
            else
            {
                if (predInstr->m_opcode == Js::OpCode::BailOnNoProfile)
                {
                    // We already have one, we don't need a second.
                    instrCopy->Free();
                }
                else
                {
                    instrCopy->m_func = predInstr->m_func;
                    predInstr->InsertAfter(instrCopy);
                    pred->SetLastInstr(instrCopy);
                }
            }
        }
    } NEXT_PREDECESSOR_BLOCK;

    // If we have a BailOnNoProfile in the first block, there must have been at least one path out of this block that always throws.
    // Don't bother keeping the bailout in the first block as there are some issues in restoring the ArgIn bytecode registers on bailout
    // and throw case should be rare enough that it won't matter for perf.
    if (block->GetBlockNum() != 0)
    {
        blockHeadInstr->isOpHelper = true;
#if DBG
        blockHeadInstr->m_noHelperAssert = true;
#endif

        instr->m_func = curInstr->m_func;

        if (insertionPointForGenerator != nullptr)
        {
            insertionPointForGenerator->InsertAfter(instr);
            block->beginsBailOnNoProfile = false;
        }
        else
        {
            curInstr->InsertAfter(instr);
            block->beginsBailOnNoProfile = true;
        }

        bool setLastInstr = (curInstr == block->GetLastInstr());
        if (setLastInstr)
        {
            block->SetLastInstr(instr);
        }

        if (this->DoMarkTempObjects())
        {
            block->tempObjectTracker->ProcessBailOnNoProfile(instr);
        }
        return false;
    }
    else
    {
        instr->Free();
        return true;
    }
}